

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O3

int SZIP_stat(void *opaque,char *path,PHYSFS_Stat *stat)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  pvVar1 = __PHYSFS_DirTreeFind((__PHYSFS_DirTree *)opaque,path);
  if (pvVar1 == (void *)0x0) {
    return 0;
  }
  uVar3 = (ulong)*(uint *)((long)pvVar1 + 0x28);
  bVar5 = *(int *)((long)pvVar1 + 0x20) == 0;
  if (bVar5) {
    lVar2 = *(long *)(*(long *)((long)opaque + 0x90) +
                     (ulong)(*(uint *)((long)pvVar1 + 0x28) + 1) * 8) -
            *(long *)(*(long *)((long)opaque + 0x90) + uVar3 * 8);
  }
  else {
    lVar2 = -1;
  }
  stat->filesize = lVar2;
  stat->filetype = (uint)!bVar5;
  lVar2 = *(long *)((long)opaque + 200);
  if (lVar2 == 0) {
    lVar2 = *(long *)((long)opaque + 0xd8);
    if (lVar2 == 0) {
      *(undefined4 *)&stat->modtime = 0xffffffff;
      *(undefined4 *)((long)&stat->modtime + 4) = 0xffffffff;
      *(undefined4 *)&stat->createtime = 0xffffffff;
      *(undefined4 *)((long)&stat->createtime + 4) = 0xffffffff;
      goto LAB_0010d66a;
    }
    stat->modtime =
         ((ulong)*(uint *)(lVar2 + uVar3 * 8) + 0xfe624e212ac18000 +
         ((ulong)*(uint *)(lVar2 + 4 + uVar3 * 8) << 0x20)) / 10000000;
LAB_0010d64c:
    uVar4 = ((ulong)*(uint *)(lVar2 + uVar3 * 8) + 0xfe624e212ac18000 +
            ((ulong)*(uint *)(lVar2 + 4 + uVar3 * 8) << 0x20)) / 10000000;
  }
  else {
    uVar4 = ((ulong)*(uint *)(lVar2 + uVar3 * 8) + 0xfe624e212ac18000 +
            ((ulong)*(uint *)(lVar2 + 4 + uVar3 * 8) << 0x20)) / 10000000;
    stat->modtime = uVar4;
    lVar2 = *(long *)((long)opaque + 0xd8);
    if (lVar2 != 0) goto LAB_0010d64c;
  }
  stat->createtime = uVar4;
LAB_0010d66a:
  stat->accesstime = -1;
  stat->readonly = 1;
  return 1;
}

Assistant:

static int SZIP_stat(void *opaque, const char *path, PHYSFS_Stat *stat)
{
    SZIPinfo *info = (SZIPinfo *) opaque;
    SZIPentry *entry;
    PHYSFS_uint32 idx;

    entry = (SZIPentry *) __PHYSFS_DirTreeFind(&info->tree, path);
    BAIL_IF_ERRPASS(!entry, 0);
    idx = entry->dbidx;

    if (entry->tree.isdir)
    {
        stat->filesize = -1;
	    stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
    } /* if */
    else
    {
        stat->filesize = (PHYSFS_sint64) SzArEx_GetFileSize(&info->db, idx);
	    stat->filetype = PHYSFS_FILETYPE_REGULAR;
    } /* else */

    if (info->db.MTime.Vals != NULL)
	    stat->modtime = lzmasdkTimeToPhysfsTime(&info->db.MTime.Vals[idx]);
    else if (info->db.CTime.Vals != NULL)
	    stat->modtime = lzmasdkTimeToPhysfsTime(&info->db.CTime.Vals[idx]);
    else
	    stat->modtime = -1;

    if (info->db.CTime.Vals != NULL)
	    stat->createtime = lzmasdkTimeToPhysfsTime(&info->db.CTime.Vals[idx]);
    else if (info->db.MTime.Vals != NULL)
	    stat->createtime = lzmasdkTimeToPhysfsTime(&info->db.MTime.Vals[idx]);
    else
	    stat->createtime = -1;

	stat->accesstime = -1;
	stat->readonly = 1;

    return 1;
}